

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleArrayHandling.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  Slice slice;
  ostream *poVar2;
  ValueLength VVar3;
  void *pvVar4;
  undefined1 *puVar5;
  exception *ex;
  Slice *it;
  default_sentinel_t __end1;
  ArrayIterator __begin1;
  ArrayIterator *__range1;
  Slice f;
  Builder filtered;
  Slice s;
  size_t i;
  Builder b;
  Builder *in_stack_fffffffffffffcd8;
  Builder *in_stack_fffffffffffffce0;
  undefined6 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcee;
  ValueType in_stack_fffffffffffffcef;
  Slice in_stack_fffffffffffffcf0;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffffd08;
  Builder *in_stack_fffffffffffffd10;
  Predicate *in_stack_fffffffffffffd18;
  Slice in_stack_fffffffffffffd20;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_fffffffffffffd28;
  Predicate *predicate;
  function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)> local_288;
  uint8_t *local_268;
  uint8_t *local_260;
  uint8_t **local_258;
  ArrayIterator local_248;
  uint8_t *local_228;
  ArrayIterator local_220;
  ArrayIterator *local_200;
  uint8_t *local_1f8;
  Predicate local_1e8;
  uint8_t *local_1c8;
  Slice local_108;
  undefined1 local_100 [16];
  ulong local_f0;
  undefined1 local_e8 [32];
  Builder local_c8;
  int local_4;
  
  local_4 = 0;
  arangodb::velocypack::Builder::Builder(in_stack_fffffffffffffd10);
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffcf0._start,in_stack_fffffffffffffcef,
             (bool)in_stack_fffffffffffffcee);
  puVar5 = local_e8;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffce0,(Value *)in_stack_fffffffffffffcd8);
  for (local_f0 = 0; local_f0 < 10; local_f0 = local_f0 + 1) {
    puVar5 = local_100;
    arangodb::velocypack::Value::Value
              ((Value *)in_stack_fffffffffffffce0,(uint64_t)in_stack_fffffffffffffcd8,None);
    arangodb::velocypack::Builder::add(in_stack_fffffffffffffce0,(Value *)in_stack_fffffffffffffcd8)
    ;
  }
  arangodb::velocypack::Builder::close(&local_c8,(int)puVar5);
  slice._start = arangodb::velocypack::Builder::start(in_stack_fffffffffffffce0);
  arangodb::velocypack::Slice::Slice(&local_108,slice._start);
  local_1c8 = local_108._start;
  predicate = &local_1e8;
  std::function<bool(arangodb::velocypack::Slice_const&,unsigned_long)>::function<main::__0,void>
            ((function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)> *)
             in_stack_fffffffffffffcf0._start,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
  arangodb::velocypack::Collection::filter(slice,predicate);
  std::function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)>::~function
            ((function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)> *)0x103609);
  local_1f8 = (uint8_t *)arangodb::velocypack::Builder::slice(in_stack_fffffffffffffcd8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Filtered length: ");
  VVar3 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::length(in_stack_fffffffffffffd28);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,VVar3);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Iterating Array members:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_228 = local_1f8;
  arangodb::velocypack::ArrayIterator::ArrayIterator
            ((ArrayIterator *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
             in_stack_fffffffffffffcf0);
  local_200 = &local_220;
  arangodb::velocypack::ArrayIterator::begin(&local_248,local_200);
  arangodb::velocypack::ArrayIterator::end(local_200);
  while( true ) {
    bVar1 = arangodb::velocypack::ArrayIterator::operator==(&local_248);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_fffffffffffffd20 =
         arangodb::velocypack::ArrayIterator::operator*((ArrayIterator *)in_stack_fffffffffffffcd8);
    local_258 = &local_260;
    local_260 = in_stack_fffffffffffffd20._start;
    in_stack_fffffffffffffd18 =
         (Predicate *)
         arangodb::velocypack::operator<<
                   ((ostream *)in_stack_fffffffffffffce0,(Slice *)in_stack_fffffffffffffcd8);
    poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffd18,", number value: ");
    in_stack_fffffffffffffd08 =
         (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
         arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
         getUInt(in_stack_fffffffffffffd08);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,(ulong)in_stack_fffffffffffffd08);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    arangodb::velocypack::ArrayIterator::operator++((ArrayIterator *)in_stack_fffffffffffffce0);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Iterating some Array members using forEach:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_268 = local_1f8;
  std::function<bool(arangodb::velocypack::Slice_const&,unsigned_long)>::function<main::__1,void>
            (&local_288,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
  arangodb::velocypack::Collection::forEach(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)>::~function
            ((function<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long)> *)0x10388b);
  arangodb::velocypack::Builder::~Builder(in_stack_fffffffffffffce0);
  arangodb::velocypack::Builder::~Builder(in_stack_fffffffffffffce0);
  return local_4;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an array with 10 number members
  Builder b;

  b(Value(ValueType::Array));
  for (size_t i = 0; i < 10; ++i) {
    b.add(Value(i));
  }
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // filter out all array values less than 5
  Builder filtered =
      Collection::filter(s, [](Slice const& current, ValueLength) {
        if (current.getNumber<int>() < 5) {
          // exclude
          return false;
        }
        // include
        return true;
      });

  // print filtered array
  Slice f(filtered.slice());
  std::cout << "Filtered length: " << f.length() << std::endl;

  // now iterate over the (left over) array members
  std::cout << "Iterating Array members:" << std::endl;
  for (auto const& it : ArrayIterator(f)) {
    std::cout << it << ", number value: " << it.getUInt() << std::endl;
  }

  // iterate again, this time using Collection::forEach
  std::cout << "Iterating some Array members using forEach:" << std::endl;
  Collection::forEach(f, [](Slice const& current, ValueLength index) {
    std::cout << current << ", number value: " << current.getUInt()
              << std::endl;
    return (index != 2);  // stop after the 3rd element (indexes are 0-based)
  });

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}